

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

TokenOrSyntax * __thiscall
slang::syntax::LineDirectiveSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,LineDirectiveSyntax *this,size_t index)

{
  Token local_20;
  
  switch(index) {
  case 0:
    local_20.kind = (this->super_DirectiveSyntax).directive.kind;
    local_20._2_1_ = (this->super_DirectiveSyntax).directive.field_0x2;
    local_20.numFlags.raw = (this->super_DirectiveSyntax).directive.numFlags.raw;
    local_20.rawLen = (this->super_DirectiveSyntax).directive.rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->super_DirectiveSyntax).directive.info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->super_DirectiveSyntax).directive.info + 4);
    break;
  case 1:
    local_20.kind = (this->lineNumber).kind;
    local_20._2_1_ = (this->lineNumber).field_0x2;
    local_20.numFlags.raw = (this->lineNumber).numFlags.raw;
    local_20.rawLen = (this->lineNumber).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->lineNumber).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->lineNumber).info + 4);
    break;
  case 2:
    local_20.kind = (this->fileName).kind;
    local_20._2_1_ = (this->fileName).field_0x2;
    local_20.numFlags.raw = (this->fileName).numFlags.raw;
    local_20.rawLen = (this->fileName).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->fileName).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->fileName).info + 4);
    break;
  case 3:
    local_20.kind = (this->level).kind;
    local_20._2_1_ = (this->level).field_0x2;
    local_20.numFlags.raw = (this->level).numFlags.raw;
    local_20.rawLen = (this->level).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->level).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->level).info + 4);
    break;
  default:
    parsing::Token::Token(&local_20);
  }
  *(undefined4 *)
   &(__return_storage_ptr__->super_ConstTokenOrSyntax).
    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
       local_20._0_4_;
  *(uint32_t *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 4) =
       local_20.rawLen;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 8) =
       local_20.info._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0xc) =
       local_20.info._4_4_;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10)
       = '\0';
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax LineDirectiveSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return directive;
        case 1: return lineNumber;
        case 2: return fileName;
        case 3: return level;
        default: return nullptr;
    }
}